

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AssertionExpr.cpp
# Opt level: O1

optional<slang::ast::SequenceRange> __thiscall
slang::ast::SequenceWithMatchExpr::computeSequenceLengthImpl(SequenceWithMatchExpr *this)

{
  SequenceLengthVisitor *in_RSI;
  optional<slang::ast::SequenceRange> oVar2;
  SequenceRange res;
  _Storage<slang::ast::SequenceRange,_true> _Var3;
  ulong uVar1;
  
  oVar2 = AssertionExpr::visit<(anonymous_namespace)::SequenceLengthVisitor>(this->expr,in_RSI);
  uVar1 = oVar2.super__Optional_base<slang::ast::SequenceRange,_true,_true>._M_payload.
          super__Optional_payload_base<slang::ast::SequenceRange>._8_8_;
  if (((uVar1 >> 0x20 & 1) == 0) ||
     ((this->repetition).super__Optional_base<slang::ast::SequenceRepetition,_true,_true>._M_payload
      .super__Optional_payload_base<slang::ast::SequenceRepetition>._M_engaged != true)) {
    _Var3 = oVar2.super__Optional_base<slang::ast::SequenceRange,_true,_true>._M_payload.
            super__Optional_payload_base<slang::ast::SequenceRange>._M_payload;
  }
  else {
    res.max.super__Optional_base<unsigned_int,_true,_true>._M_payload.
    super__Optional_payload_base<unsigned_int>._4_4_ = (undefined4)(uVar1 & 0xff);
    res.min = (int)oVar2.super__Optional_base<slang::ast::SequenceRange,_true,_true>._M_payload.
                   super__Optional_payload_base<slang::ast::SequenceRange>._M_payload._0_8_;
    res.max.super__Optional_base<unsigned_int,_true,_true>._M_payload.
    super__Optional_payload_base<unsigned_int>._M_payload =
         (_Storage<unsigned_int,_true>)
         (int)((ulong)oVar2.super__Optional_base<slang::ast::SequenceRange,_true,_true>._M_payload.
                      super__Optional_payload_base<slang::ast::SequenceRange>._M_payload._0_8_ >>
              0x20);
    _Var3._M_value = SequenceRepetition::applyTo((SequenceRepetition *)&this->repetition,res);
  }
  oVar2.super__Optional_base<slang::ast::SequenceRange,_true,_true>._M_payload.
  super__Optional_payload_base<slang::ast::SequenceRange>._M_payload._0_8_ = _Var3._0_8_;
  oVar2.super__Optional_base<slang::ast::SequenceRange,_true,_true>._M_payload.
  super__Optional_payload_base<slang::ast::SequenceRange>._8_8_ =
       (ulong)(_Var3._8_4_ & 0xff) | uVar1 & 0xffffffffffffff00;
  return (optional<slang::ast::SequenceRange>)
         oVar2.super__Optional_base<slang::ast::SequenceRange,_true,_true>._M_payload.
         super__Optional_payload_base<slang::ast::SequenceRange>;
}

Assistant:

std::optional<SequenceRange> SequenceWithMatchExpr::computeSequenceLengthImpl() const {
    auto res = expr.computeSequenceLength();
    if (res && repetition)
        res = repetition->applyTo(*res);
    return res;
}